

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O0

void __thiscall
spdlog::pattern_formatter::format(pattern_formatter *this,log_msg *msg,memory_buf_t *dest)

{
  string_view_t view;
  bool bVar1;
  iterator iVar2;
  iterator iVar3;
  pointer pfVar4;
  undefined8 in_RDX;
  long in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
  *f;
  iterator __end1;
  iterator __begin1;
  vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
  *__range1;
  __enable_if_is_duration<std::chrono::duration<long>_> secs;
  basic_string_view<char> *in_stack_ffffffffffffff70;
  memory_buf_t *in_stack_ffffffffffffff80;
  log_msg *in_stack_ffffffffffffff88;
  __normal_iterator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_*,_std::vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>_>
  in_stack_ffffffffffffff90;
  undefined1 local_60 [56];
  rep local_28;
  pointer local_20;
  undefined8 local_18;
  long local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  if ((in_RDI[2]._M_string_length & 0x100000000) != 0) {
    local_28 = (rep)std::chrono::
                    time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                    ::time_since_epoch((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                        *)(in_RSI + 0x18));
    local_20 = (pointer)std::chrono::
                        duration_cast<std::chrono::duration<long,std::ratio<1l,1l>>,long,std::ratio<1l,1000000000l>>
                                  ((duration<long,_std::ratio<1L,_1000000000L>_> *)in_RDI);
    bVar1 = std::chrono::operator!=
                      ((duration<long,_std::ratio<1L,_1L>_> *)in_stack_ffffffffffffff70,
                       (duration<long,_std::ratio<1L,_1L>_> *)in_RDI);
    if (bVar1) {
      get_time_((pattern_formatter *)in_stack_ffffffffffffff90._M_current,in_stack_ffffffffffffff88)
      ;
      memcpy(&in_RDI[2].field_2,local_60,0x38);
      in_RDI[4]._M_string_length = (size_type)local_20;
    }
  }
  iVar2 = std::
          vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
          ::begin((vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
                   *)in_RDI);
  iVar3 = std::
          vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
          ::end((vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>
                 *)in_RDI);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_*,_std::vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>_>
                             *)in_stack_ffffffffffffff70,
                            (__normal_iterator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_*,_std::vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>_>
                             *)in_RDI), bVar1) {
    in_stack_ffffffffffffff80 =
         (memory_buf_t *)
         __gnu_cxx::
         __normal_iterator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_*,_std::vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>_>
         ::operator*((__normal_iterator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_*,_std::vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>_>
                      *)&stack0xffffffffffffff90);
    pfVar4 = std::
             unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
             ::operator->((unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>
                           *)0x1f59fb);
    (*pfVar4->_vptr_flag_formatter[2])(pfVar4,local_10,&in_RDI[2].field_2,local_18);
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_*,_std::vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>_>
    ::operator++((__normal_iterator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_*,_std::vector<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>,_std::allocator<std::unique_ptr<spdlog::details::flag_formatter,_std::default_delete<spdlog::details::flag_formatter>_>_>_>_>
                  *)&stack0xffffffffffffff90);
  }
  ::fmt::v8::basic_string_view<char>::basic_string_view<std::char_traits<char>,std::allocator<char>>
            (in_stack_ffffffffffffff70,in_RDI);
  view.size_ = (size_t)iVar2._M_current;
  view.data_ = (char *)iVar3._M_current;
  details::fmt_helper::append_string_view(view,in_stack_ffffffffffffff80);
  return;
}

Assistant:

SPDLOG_INLINE void pattern_formatter::format(const details::log_msg &msg, memory_buf_t &dest)
{
    if (need_localtime_)
    {
        const auto secs = std::chrono::duration_cast<std::chrono::seconds>(msg.time.time_since_epoch());
        if (secs != last_log_secs_)
        {
            cached_tm_ = get_time_(msg);
            last_log_secs_ = secs;
        }
    }

    for (auto &f : formatters_)
    {
        f->format(msg, cached_tm_, dest);
    }
    // write eol
    details::fmt_helper::append_string_view(eol_, dest);
}